

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_prefixDict *pZVar1;
  ZSTD_dictContentType_e dictContentType;
  void *dict;
  void *dict_00;
  ZSTD_customMem customMem;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ZSTD_CDict *pZVar6;
  size_t sVar7;
  ZSTD_paramSwitch_e ZVar8;
  size_t sVar9;
  U64 UVar10;
  ZSTD_cParamMode_e mode;
  bool bVar11;
  undefined1 auVar12 [16];
  ZSTD_CCtx_params local_120;
  ZSTD_compressionParameters local_4c;
  
  memcpy(&local_120,&cctx->requestedParams,0xd0);
  pZVar1 = &cctx->prefixDict;
  dict = (cctx->localDict).dict;
  dict_00 = (cctx->prefixDict).dict;
  sVar7 = (cctx->prefixDict).dictSize;
  dictContentType = (cctx->prefixDict).dictContentType;
  if (dict == (void *)0x0) {
    if ((cctx->localDict).dictBuffer != (void *)0x0) {
      __assert_fail("dl->dictBuffer == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4dc,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("dl->cdict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4dd,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).dictSize != 0) {
      __assert_fail("dl->dictSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4de,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
LAB_007666d5:
    pZVar1->dict = (void *)0x0;
    pZVar1->dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    pZVar6 = cctx->cdict;
    bVar11 = pZVar6 == (ZSTD_CDict *)0x0;
    if (dict_00 == (void *)0x0) {
      bVar2 = true;
      if (dict == (void *)0x0 && pZVar6 != (ZSTD_CDict *)0x0) {
        local_120.compressionLevel = pZVar6->compressionLevel;
        bVar11 = false;
      }
    }
    else {
      if (pZVar6 != (ZSTD_CDict *)0x0) {
        __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x17df,
                      "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                     );
      }
      bVar11 = true;
      bVar2 = false;
      pZVar6 = (ZSTD_CDict *)0x0;
    }
  }
  else {
    pZVar6 = (cctx->localDict).cdict;
    if (pZVar6 != (ZSTD_CDict *)0x0) {
      if (cctx->cdict != pZVar6) {
        __assert_fail("cctx->cdict == dl->cdict",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x4e3,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      goto LAB_007666d5;
    }
    sVar9 = (cctx->localDict).dictSize;
    if (sVar9 == 0) {
      __assert_fail("dl->dictSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4e6,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (cctx->cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("cctx->cdict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4e7,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (dict_00 != (void *)0x0) {
      __assert_fail("cctx->prefixDict.dict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4e8,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    customMem.opaque._4_4_ = (int)((ulong)(cctx->customMem).opaque >> 0x20);
    customMem._0_20_ = *(undefined1 (*) [20])&cctx->customMem;
    pZVar6 = ZSTD_createCDict_advanced2
                       (dict,sVar9,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,
                        &cctx->requestedParams,customMem);
    (cctx->localDict).cdict = pZVar6;
    if (pZVar6 == (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc0;
    }
    cctx->cdict = pZVar6;
    pZVar1->dict = (void *)0x0;
    pZVar1->dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    bVar2 = true;
    bVar11 = false;
  }
  if (endOp == ZSTD_e_end) {
    cctx->pledgedSrcSizePlusOne = inSize + 1;
  }
  if (bVar2) {
    if (bVar11) {
      UVar10 = cctx->pledgedSrcSizePlusOne - 1;
      sVar9 = 0;
    }
    else {
      UVar10 = cctx->pledgedSrcSizePlusOne - 1;
      sVar9 = pZVar6->dictContentSize;
LAB_00766838:
      mode = ZSTD_cpm_attachDict;
      if ((pZVar6->matchState).dedicatedDictSearch != 0) goto LAB_0076684e;
      if ((UVar10 == 0xffffffffffffffff) ||
         (UVar10 <= attachDictSizeCutoffs[(pZVar6->matchState).cParams.strategy])) {
        if (local_120.attachDictPref != ZSTD_dictForceCopy && local_120.forceWindow == 0)
        goto LAB_0076684e;
      }
      else if (local_120.attachDictPref == ZSTD_dictForceAttach && local_120.forceWindow == 0)
      goto LAB_0076684e;
    }
  }
  else {
    UVar10 = cctx->pledgedSrcSizePlusOne - 1;
    sVar9 = sVar7;
    if (!bVar11) goto LAB_00766838;
  }
  mode = ZSTD_cpm_noAttachDict;
LAB_0076684e:
  ZSTD_getCParamsFromCCtxParams(&local_4c,&local_120,UVar10,sVar9,mode);
  local_120.cParams.targetLength = local_4c.targetLength;
  local_120.cParams.strategy = local_4c.strategy;
  uVar4 = local_120.cParams._20_8_;
  local_120.cParams.windowLog = local_4c.windowLog;
  local_120.cParams.chainLog = local_4c.chainLog;
  uVar3 = local_120.cParams._0_8_;
  local_120.cParams.strategy = local_4c.strategy;
  local_120.cParams.windowLog = local_4c.windowLog;
  if ((local_120.useBlockSplitter == ZSTD_ps_auto) &&
     (local_120.useBlockSplitter = ZSTD_ps_disable, ZSTD_btlazy2 < local_120.cParams.strategy)) {
    local_120.useBlockSplitter = (local_120.cParams.windowLog < 0x11) + ZSTD_ps_enable;
  }
  if ((local_120.ldmParams.enableLdm == ZSTD_ps_auto) &&
     (local_120.ldmParams.enableLdm = ZSTD_ps_disable, ZSTD_btlazy2 < local_120.cParams.strategy)) {
    local_120.ldmParams.enableLdm = (local_120.cParams.windowLog < 0x1b) + ZSTD_ps_enable;
  }
  if ((local_120.useRowMatchFinder == ZSTD_ps_auto) &&
     (local_120.useRowMatchFinder = ZSTD_ps_disable,
     0xfffffffc < local_120.cParams.strategy - ZSTD_btlazy2)) {
    local_120.useRowMatchFinder = (local_120.cParams.windowLog < 0xf) + ZSTD_ps_enable;
  }
  sVar9 = 0x20000;
  if (local_120.maxBlockSize != 0) {
    sVar9 = local_120.maxBlockSize;
  }
  ZVar8 = (local_120.compressionLevel < 10) + ZSTD_ps_enable;
  if (local_120.searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar8 = local_120.searchForExternalRepcodes;
  }
  local_120.cParams.chainLog = local_4c.chainLog;
  auVar12._0_4_ = -(uint)(0x7fffffe9 < (int)(local_120.cParams.windowLog - 0x20 ^ 0x80000000));
  auVar12._4_4_ = -(uint)(0x7fffffe6 < (int)(local_120.cParams.chainLog - 0x1f ^ 0x80000000));
  auVar12._8_4_ = -(uint)(0x7fffffe6 < (int)(local_4c.hashLog - 0x1f ^ 0x80000000));
  auVar12._12_4_ = -(uint)(0x7fffffe1 < (int)(local_4c.searchLog - 0x1f ^ 0x80000000));
  iVar5 = movmskps(local_120.cParams.windowLog,auVar12);
  local_120.cParams._0_8_ = uVar3;
  local_120.cParams._20_8_ = uVar4;
  local_120.maxBlockSize = sVar9;
  local_120.searchForExternalRepcodes = ZVar8;
  if ((((iVar5 == 0xf) && (local_4c.minMatch - 3 < 5)) &&
      (local_120.cParams.targetLength = local_4c.targetLength,
      local_120.cParams.targetLength < 0x20001)) && (local_120.cParams.strategy - ZSTD_fast < 9)) {
    UVar10 = cctx->pledgedSrcSizePlusOne - 1;
    sVar7 = ZSTD_compressBegin_internal
                      (cctx,dict_00,sVar7,dictContentType,ZSTD_dtlm_fast,cctx->cdict,&local_120,
                       UVar10,ZSTDb_buffered);
    if (sVar7 < 0xffffffffffffff89) {
      if ((cctx->appliedParams).nbWorkers != 0) {
        __assert_fail("cctx->appliedParams.nbWorkers == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1825,
                      "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                     );
      }
      cctx->inToCompress = 0;
      cctx->inBuffPos = 0;
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
        sVar7 = (ulong)(cctx->blockSize == UVar10) + cctx->blockSize;
      }
      else {
        sVar7 = 0;
      }
      cctx->inBuffTarget = sVar7;
      cctx->outBuffContentSize = 0;
      cctx->outBuffFlushedSize = 0;
      cctx->streamStage = zcss_load;
      cctx->frameEnded = 0;
      sVar7 = 0;
    }
    return sVar7;
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x181f,
                "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)");
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        params.useSequenceProducer == 1 && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}